

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

cmSourceFile * __thiscall cmMakefile::GetSource(cmMakefile *this,string *sourceName)

{
  bool bVar1;
  cmSourceFile *this_00;
  pointer ppcVar2;
  cmSourceFileLocation sfl;
  cmSourceFileLocation cStack_78;
  
  cmSourceFileLocation::cmSourceFileLocation(&cStack_78,this,sourceName);
  ppcVar2 = (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppcVar2 !=
      (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppcVar2;
      bVar1 = cmSourceFile::Matches(this_00,&cStack_78);
      if (bVar1) goto LAB_0027d461;
      ppcVar2 = ppcVar2 + 1;
    } while (ppcVar2 !=
             (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  this_00 = (cmSourceFile *)0x0;
LAB_0027d461:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cStack_78.Name._M_dataplus._M_p != &cStack_78.Name.field_2) {
    operator_delete(cStack_78.Name._M_dataplus._M_p,cStack_78.Name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cStack_78.Directory._M_dataplus._M_p != &cStack_78.Directory.field_2) {
    operator_delete(cStack_78.Directory._M_dataplus._M_p,
                    cStack_78.Directory.field_2._M_allocated_capacity + 1);
  }
  return this_00;
}

Assistant:

cmSourceFile* cmMakefile::GetSource(const std::string& sourceName) const
{
  cmSourceFileLocation sfl(this, sourceName);
  for (std::vector<cmSourceFile*>::const_iterator sfi =
         this->SourceFiles.begin();
       sfi != this->SourceFiles.end(); ++sfi) {
    cmSourceFile* sf = *sfi;
    if (sf->Matches(sfl)) {
      return sf;
    }
  }
  return CM_NULLPTR;
}